

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O0

void ctemplate_htmlparser::jsparser_buffer_append_chr(jsparser_ctx *js,char chr)

{
  char c;
  int iVar1;
  char chr_local;
  jsparser_ctx *js_local;
  
  iVar1 = js_is_whitespace(chr);
  if (iVar1 != 0) {
    c = jsparser_buffer_get(js,-1);
    iVar1 = js_is_whitespace(c);
    if (iVar1 != 0) {
      return;
    }
  }
  js->buffer[js->buffer_end] = chr;
  js->buffer_end = (js->buffer_end + 1) % 0x12;
  if (js->buffer_end == js->buffer_start) {
    js->buffer_start = (js->buffer_end + 1) % 0x12;
  }
  return;
}

Assistant:

void jsparser_buffer_append_chr(jsparser_ctx *js, char chr)
{
  /* Fold whitespace so we have enough space in the buffer. */
  if (js_is_whitespace(chr) &&
      js_is_whitespace(jsparser_buffer_get(js, -1))) {
    return;
  }

  js->buffer[js->buffer_end] = chr;
  js->buffer_end = (js->buffer_end + 1) % JSPARSER_RING_BUFFER_SIZE;
  if (js->buffer_end == js->buffer_start) {
    js->buffer_start = (js->buffer_end + 1) %
        JSPARSER_RING_BUFFER_SIZE;
  }
}